

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall
QGraphicsAnchorLayoutPrivate::setItemsGeometries(QGraphicsAnchorLayoutPrivate *this,QRectF *geom)

{
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *this_00;
  long lVar1;
  QGraphicsLayoutItem **ppQVar2;
  Data *pDVar3;
  LayoutDirection LVar4;
  Node<QGraphicsLayoutItem_*,_QHashDummyValue> *pNVar5;
  long lVar6;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar9;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar10;
  QSizeF QVar11;
  QGraphicsLayoutItem *item;
  qreal right;
  qreal left;
  qreal top;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  QGraphicsLayoutItem *local_68;
  double local_60;
  double local_58;
  double local_50;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = -NAN;
  local_58 = -NAN;
  local_60 = -NAN;
  (*((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr)->
    _vptr_QGraphicsLayoutItem[3])();
  LVar4 = QGraphicsLayoutPrivate::visualDirection(&this->super_QGraphicsLayoutPrivate);
  dVar8 = local_58;
  if (LVar4 == RightToLeft) {
    local_58 = local_60;
    local_60 = dVar8;
  }
  local_58 = local_58 + geom->xp;
  local_50 = geom->yp + local_50;
  local_60 = (geom->xp + geom->w) - local_60;
  lVar1 = (this->items).d.size;
  if (lVar1 != 0) {
    ppQVar2 = (this->items).d.ptr;
    this_00 = &this->m_vertexList;
    lVar6 = 0;
    do {
      local_68 = *(QGraphicsLayoutItem **)((long)ppQVar2 + lVar6);
      local_88 = 0.0;
      dStack_80 = 0.0;
      local_78 = 0.0;
      dStack_70 = 0.0;
      local_48.first = (QGraphicsLayoutItem *)0xbff0000000000000;
      local_48._8_8_ = 0xbff0000000000000;
      QVar11 = QGraphicsLayoutItem::effectiveSizeHint(local_68,PreferredSize,(QSizeF *)&local_48);
      dVar8 = QVar11.ht;
      pDVar3 = (this->m_floatItems).m_data[0].q_hash.d;
      if (pDVar3 == (Data *)0x0) {
LAB_005cfe69:
        local_48.first = local_68;
        local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
        pVar9 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                ::value(this_00,&local_48);
        local_48.first = local_68;
        local_48.second = 2;
        pVar10 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                 ::value(this_00,&local_48);
        if (LVar4 == LeftToRight) {
          dVar7 = (pVar9.first)->distance + local_58;
          local_78 = local_58 + (pVar10.first)->distance;
        }
        else {
          dVar7 = local_60 - (pVar10.first)->distance;
          local_78 = local_60 - (pVar9.first)->distance;
        }
        local_88 = local_88 + (dVar7 - local_88);
        local_78 = local_78 - local_88;
      }
      else {
        pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QGraphicsLayoutItem*,QHashDummyValue>>::
                 findNode<QGraphicsLayoutItem*>
                           ((Data<QHashPrivate::Node<QGraphicsLayoutItem*,QHashDummyValue>> *)pDVar3
                            ,&local_68);
        if (pNVar5 == (Node<QGraphicsLayoutItem_*,_QHashDummyValue> *)0x0) goto LAB_005cfe69;
        local_88 = (0.0 - local_88) + local_88;
        local_78 = QVar11.wd - local_88;
      }
      pDVar3 = (this->m_floatItems).m_data[1].q_hash.d;
      if (pDVar3 == (Data *)0x0) {
LAB_005cff62:
        local_48.first = local_68;
        local_48.second = AnchorTop;
        pVar9 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                ::value(this_00,&local_48);
        local_48.first = local_68;
        local_48.second = 5;
        pVar10 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                 ::value(this_00,&local_48);
        dStack_80 = dStack_80 + (((pVar9.first)->distance + local_50) - dStack_80);
        dVar8 = local_50 + (pVar10.first)->distance;
      }
      else {
        pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QGraphicsLayoutItem*,QHashDummyValue>>::
                 findNode<QGraphicsLayoutItem*>
                           ((Data<QHashPrivate::Node<QGraphicsLayoutItem*,QHashDummyValue>> *)pDVar3
                            ,&local_68);
        if (pNVar5 == (Node<QGraphicsLayoutItem_*,_QHashDummyValue> *)0x0) goto LAB_005cff62;
        dStack_80 = (0.0 - dStack_80) + dStack_80;
      }
      dStack_70 = dVar8 - dStack_80;
      (*local_68->_vptr_QGraphicsLayoutItem[2])(local_68,&local_88);
      lVar6 = lVar6 + 8;
    } while (lVar1 << 3 != lVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::setItemsGeometries(const QRectF &geom)
{
    Q_Q(QGraphicsAnchorLayout);
    AnchorVertex *firstH, *secondH, *firstV, *secondV;

    qreal top;
    qreal left;
    qreal right;

    q->getContentsMargins(&left, &top, &right, nullptr);
    const Qt::LayoutDirection visualDir = visualDirection();
    if (visualDir == Qt::RightToLeft)
        qSwap(left, right);

    left += geom.left();
    top += geom.top();
    right = geom.right() - right;

    for (QGraphicsLayoutItem *item : std::as_const(items)) {
        QRectF newGeom;
        QSizeF itemPreferredSize = item->effectiveSizeHint(Qt::PreferredSize);
        if (m_floatItems[Qt::Horizontal].contains(item)) {
            newGeom.setLeft(0);
            newGeom.setRight(itemPreferredSize.width());
        } else {
            firstH = internalVertex(item, Qt::AnchorLeft);
            secondH = internalVertex(item, Qt::AnchorRight);

            if (visualDir == Qt::LeftToRight) {
                newGeom.setLeft(left + firstH->distance);
                newGeom.setRight(left + secondH->distance);
            } else {
                newGeom.setLeft(right - secondH->distance);
                newGeom.setRight(right - firstH->distance);
            }
        }

        if (m_floatItems[Qt::Vertical].contains(item)) {
            newGeom.setTop(0);
            newGeom.setBottom(itemPreferredSize.height());
        } else {
            firstV = internalVertex(item, Qt::AnchorTop);
            secondV = internalVertex(item, Qt::AnchorBottom);

            newGeom.setTop(top + firstV->distance);
            newGeom.setBottom(top + secondV->distance);
        }

        item->setGeometry(newGeom);
    }
}